

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  jpeg_entropy_decoder *pjVar4;
  int *piVar5;
  JBLOCKROW paJVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  JCOEF *pJVar10;
  int *natural_order;
  int m1;
  int p1;
  int kex;
  int k;
  int tbl;
  uchar *st;
  JCOEFPTR thiscoef;
  JBLOCKROW block;
  arith_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar4 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar4[4].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    *(int *)((long)&pjVar4[4].start_pass + 4) = *(int *)((long)&pjVar4[4].start_pass + 4) + -1;
  }
  if (*(int *)&pjVar4[2].start_pass != -1) {
    piVar5 = cinfo->natural_order;
    paJVar6 = *MCU_data;
    iVar1 = cinfo->cur_comp_info[0]->ac_tbl_no;
    iVar2 = cinfo->Al;
    iVar3 = cinfo->Al;
    m1 = cinfo->Se;
    while ((0 < m1 && ((*paJVar6)[piVar5[m1]] == 0))) {
      m1 = m1 + -1;
    }
    p1 = cinfo->Ss;
    while ((p1 <= cinfo->Se &&
           ((_k = (&pjVar4[0xc].decode_mcu)[iVar1] + (p1 + -1) * 3, p1 <= m1 ||
            (iVar9 = arith_decode(cinfo,(uchar *)_k), iVar9 == 0))))) {
      while( true ) {
        pJVar10 = *paJVar6 + piVar5[p1];
        sVar7 = (short)(-1 << ((byte)iVar3 & 0x1f));
        sVar8 = (short)(1 << ((byte)iVar2 & 0x1f));
        if (*pJVar10 != 0) break;
        iVar9 = arith_decode(cinfo,(uchar *)(_k + 1));
        if (iVar9 != 0) {
          iVar9 = arith_decode(cinfo,(uchar *)&pjVar4[0x14].decode_mcu);
          if (iVar9 == 0) {
            *pJVar10 = sVar8;
          }
          else {
            *pJVar10 = sVar7;
          }
          goto LAB_00120bc1;
        }
        _k = _k + 3;
        p1 = p1 + 1;
        if (cinfo->Se < p1) {
          cinfo->err->msg_code = 0x75;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
          *(undefined4 *)&pjVar4[2].start_pass = 0xffffffff;
          return 1;
        }
      }
      iVar9 = arith_decode(cinfo,(uchar *)(_k + 2));
      if (iVar9 != 0) {
        if (*pJVar10 < 0) {
          *pJVar10 = *pJVar10 + sVar7;
        }
        else {
          *pJVar10 = *pJVar10 + sVar8;
        }
      }
LAB_00120bc1:
      p1 = p1 + 1;
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, p1, m1;
  const int * natural_order;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;
  int num_newnz;
  int newnz_pos[DCTSIZE2];

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, don't modify the MCU.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    p1 = 1 << cinfo->Al;	/* 1 in the bit position being coded */
    m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */
    natural_order = cinfo->natural_order;

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
    EOBRUN = entropy->saved.EOBRUN; /* only part of saved state we need */

    /* There is always only one block per MCU */
    block = MCU_data[0];
    tbl = entropy->ac_derived_tbl;

    /* If we are forced to suspend, we must undo the assignments to any newly
     * nonzero coefficients in the block, because otherwise we'd get confused
     * next time about which coefficients were already nonzero.
     * But we need not undo addition of bits to already-nonzero coefficients;
     * instead, we can test the current bit to see if we already did it.
     */
    num_newnz = 0;

    /* initialize coefficient loop counter to start of band */
    k = cinfo->Ss;

    if (EOBRUN == 0) {
      for (; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, goto undoit, label3);
	r = s >> 4;
	s &= 15;
	if (s) {
	  if (s != 1)		/* size of new coef should always be 1 */
	    WARNMS(cinfo, JWRN_HUFF_BAD_CODE);
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1))
	    s = p1;		/* newly nonzero coef is positive */
	  else
	    s = m1;		/* newly nonzero coef is negative */
	} else {
	  if (r != 15) {
	    EOBRUN = 1 << r;	/* EOBr, run length is 2^r + appended bits */
	    if (r) {
	      CHECK_BIT_BUFFER(br_state, r, goto undoit);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    break;		/* rest of block is handled by EOB logic */
	  }
	  /* note s = 0 for processing ZRL */
	}
	/* Advance over already-nonzero coefs and r still-zero coefs,
	 * appending correction bits to the nonzeroes.  A correction bit is 1
	 * if the absolute value of the coefficient must be increased.
	 */
	do {
	  thiscoef = *block + natural_order[k];
	  if (*thiscoef != 0) {
	    CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	    if (GET_BITS(1)) {
	      if ((*thiscoef & p1) == 0) { /* do nothing if already set it */
		if (*thiscoef >= 0)
		  *thiscoef += p1;
		else
		  *thiscoef += m1;
	      }
	    }
	  } else {
	    if (--r < 0)
	      break;		/* reached target zero coefficient */
	  }
	  k++;
	} while (k <= Se);
	if (s) {
	  int pos = natural_order[k];
	  /* Output newly nonzero coefficient */
	  (*block)[pos] = (JCOEF) s;
	  /* Remember its position in case we have to suspend */
	  newnz_pos[num_newnz++] = pos;
	}
      }
    }

    if (EOBRUN > 0) {
      /* Scan any remaining coefficient positions after the end-of-band
       * (the last newly nonzero coefficient, if any).  Append a correction
       * bit to each already-nonzero coefficient.  A correction bit is 1
       * if the absolute value of the coefficient must be increased.
       */
      for (; k <= Se; k++) {
	thiscoef = *block + natural_order[k];
	if (*thiscoef != 0) {
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1)) {
	    if ((*thiscoef & p1) == 0) { /* do nothing if already changed it */
	      if (*thiscoef >= 0)
		*thiscoef += p1;
	      else
		*thiscoef += m1;
	    }
	  }
	}
      }
      /* Count one block completed in EOB run */
      EOBRUN--;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    entropy->saved.EOBRUN = EOBRUN; /* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;

undoit:
  /* Re-zero any output coefficients that we made newly nonzero */
  while (num_newnz > 0)
    (*block)[newnz_pos[--num_newnz]] = 0;

  return FALSE;
}